

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::SingularStringView::GenerateClearingCode
          (SingularStringView *this,Printer *p)

{
  char *pcVar1;
  LogMessageFatal LStack_18;
  undefined8 uVar2;
  
  if ((this->super_FieldGeneratorBase).is_oneof_ == true) {
    if (this->opts_->experimental_use_micro_string == true) {
      pcVar1 = "\n        if (GetArena() == nullptr) $field_$.Destroy();\n      ";
      uVar2 = 0x3e;
    }
    else {
      pcVar1 = "\n      $field_$.Destroy();\n    ";
      uVar2 = 0x1f;
    }
  }
  else if (((((this->super_FieldGeneratorBase).field_)->field_20).default_value_enum_)->all_names_
           == (string *)0x0) {
    if (this->opts_->experimental_use_micro_string == true) {
      pcVar1 = "\n        $field_$.Clear();\n      ";
      uVar2 = 0x21;
    }
    else {
      pcVar1 = "\n      $field_$.ClearToEmpty();\n    ";
      uVar2 = 0x24;
    }
  }
  else {
    if ((this->super_FieldGeneratorBase).is_inlined_ == true) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&LStack_18,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/field_generators/string_view_field.cc"
                 ,0x187,"!is_inlined()");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
    }
    pcVar1 = "\n    $field_$.ClearToDefault($lazy_var$, GetArena());\n  ";
    uVar2 = 0x38;
  }
  io::Printer::Emit(p,uVar2,pcVar1);
  return;
}

Assistant:

void SingularStringView::GenerateClearingCode(io::Printer* p) const {
  if (is_oneof()) {
    if (use_micro_string()) {
      p->Emit(R"cc(
        if (GetArena() == nullptr) $field_$.Destroy();
      )cc");
      return;
    }
    p->Emit(R"cc(
      $field_$.Destroy();
    )cc");
    return;
  }

  if (EmptyDefault()) {
    if (use_micro_string()) {
      p->Emit(R"cc(
        $field_$.Clear();
      )cc");
      return;
    }
    p->Emit(R"cc(
      $field_$.ClearToEmpty();
    )cc");
    return;
  }

  ABSL_DCHECK(!is_inlined());
  p->Emit(R"cc(
    $field_$.ClearToDefault($lazy_var$, GetArena());
  )cc");
}